

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O1

void av1_highbd_convolve_horiz_rs_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               int16_t *x_filters,int x0_qn,int x_step_qn,int bd)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [12];
  ulong uVar8;
  long lVar9;
  uint16_t *puVar10;
  uint uVar11;
  uint16_t uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar21 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined2 uVar22;
  
  if (0 < h) {
    puVar10 = src + -3;
    iVar13 = 0;
    do {
      if (0 < w) {
        uVar8 = 0;
        uVar11 = x0_qn;
        do {
          iVar14 = 0;
          iVar15 = 0;
          iVar16 = 0;
          iVar17 = 0;
          lVar9 = 0;
          do {
            uVar1 = *(ulong *)(puVar10 + ((int)uVar11 >> 0xe) + lVar9);
            auVar3._8_4_ = 0;
            auVar3._0_8_ = uVar1;
            auVar3._12_2_ = (short)(uVar1 >> 0x30);
            auVar4._8_2_ = (short)(uVar1 >> 0x20);
            auVar4._0_8_ = uVar1;
            auVar4._10_4_ = auVar3._10_4_;
            auVar6._6_8_ = 0;
            auVar6._0_6_ = auVar4._8_6_;
            auVar5._4_2_ = (short)(uVar1 >> 0x10);
            auVar5._0_4_ = (uint)uVar1;
            auVar5._6_8_ = SUB148(auVar6 << 0x40,6);
            uVar2 = *(ulong *)((long)x_filters + lVar9 * 2 + (ulong)(uVar11 >> 4 & 0x3f0));
            uVar22 = (undefined2)(uVar2 >> 0x30);
            auVar20._8_4_ = 0;
            auVar20._0_8_ = uVar2;
            auVar20._12_2_ = uVar22;
            auVar20._14_2_ = uVar22;
            uVar22 = (undefined2)(uVar2 >> 0x20);
            auVar19._12_4_ = auVar20._12_4_;
            auVar19._8_2_ = 0;
            auVar19._0_8_ = uVar2;
            auVar19._10_2_ = uVar22;
            auVar18._10_6_ = auVar19._10_6_;
            auVar18._8_2_ = uVar22;
            auVar18._0_8_ = uVar2;
            uVar22 = (undefined2)(uVar2 >> 0x10);
            auVar7._4_8_ = auVar18._8_8_;
            auVar7._2_2_ = uVar22;
            auVar7._0_2_ = uVar22;
            auVar21._0_4_ = (int)(short)uVar2;
            auVar21._4_4_ = auVar7._0_4_ >> 0x10;
            auVar21._8_4_ = auVar18._8_4_ >> 0x10;
            auVar21._12_4_ = auVar19._12_4_ >> 0x10;
            iVar14 = iVar14 + auVar21._0_4_ * ((uint)uVar1 & 0xffff);
            iVar15 = iVar15 + auVar5._4_4_ * auVar21._4_4_;
            iVar16 = iVar16 + (int)((auVar21._8_8_ & 0xffffffff) *
                                   ((ulong)auVar4._8_6_ & 0xffffffff));
            iVar17 = iVar17 + (auVar3._10_4_ >> 0x10) * auVar21._12_4_;
            lVar9 = lVar9 + 4;
          } while (lVar9 != 8);
          iVar14 = iVar17 + iVar15 + iVar16 + iVar14 + 0x40 >> 7;
          if (bd == 10) {
            if (0x3fe < iVar14) {
              iVar14 = 0x3ff;
            }
          }
          else if (bd == 0xc) {
            if (0xffe < iVar14) {
              iVar14 = 0xfff;
            }
          }
          else if (0xfe < iVar14) {
            iVar14 = 0xff;
          }
          uVar12 = (uint16_t)iVar14;
          if (iVar14 < 1) {
            uVar12 = 0;
          }
          dst[uVar8] = uVar12;
          uVar11 = uVar11 + x_step_qn;
          uVar8 = uVar8 + 1;
        } while (uVar8 != (uint)w);
      }
      dst = dst + dst_stride;
      iVar13 = iVar13 + 1;
      puVar10 = puVar10 + src_stride;
    } while (iVar13 != h);
  }
  return;
}

Assistant:

void av1_highbd_convolve_horiz_rs_c(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const int16_t *x_filters, int x0_qn,
                                    int x_step_qn, int bd) {
  src -= UPSCALE_NORMATIVE_TAPS / 2 - 1;
  for (int y = 0; y < h; ++y) {
    int x_qn = x0_qn;
    for (int x = 0; x < w; ++x) {
      const uint16_t *const src_x = &src[x_qn >> RS_SCALE_SUBPEL_BITS];
      const int x_filter_idx =
          (x_qn & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
      assert(x_filter_idx <= RS_SUBPEL_MASK);
      const int16_t *const x_filter =
          &x_filters[x_filter_idx * UPSCALE_NORMATIVE_TAPS];
      int sum = 0;
      for (int k = 0; k < UPSCALE_NORMATIVE_TAPS; ++k)
        sum += src_x[k] * x_filter[k];
      dst[x] = clip_pixel_highbd(ROUND_POWER_OF_TWO(sum, FILTER_BITS), bd);
      x_qn += x_step_qn;
    }
    src += src_stride;
    dst += dst_stride;
  }
}